

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O0

void * absl::lts_20240722::flags_internal::FlagOps<int>(FlagOp op,void *v1,void *v2,void *v3)

{
  bool bVar1;
  size_t offset;
  size_t round_to;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  allocator<AlignedSpace> local_51;
  int temp;
  Allocator alloc_1;
  int *p;
  allocator<AlignedSpace> local_31;
  void *pvStack_30;
  Allocator alloc;
  void *v3_local;
  void *v2_local;
  void *v1_local;
  type_info *ptStack_10;
  FlagOp op_local;
  
  pvStack_30 = v3;
  switch(op) {
  case kAlloc:
    std::allocator<AlignedSpace>::allocator(&local_31);
    ptStack_10 = (type_info *)
                 std::allocator_traits<std::allocator<AlignedSpace>_>::allocate(&local_31,1);
    std::allocator<AlignedSpace>::~allocator(&local_31);
    break;
  case kDelete:
    _temp = (pointer)v2;
    std::allocator<AlignedSpace>::allocator(&local_51);
    std::allocator_traits<std::allocator<AlignedSpace>_>::deallocate(&local_51,_temp,1);
    ptStack_10 = (type_info *)0x0;
    std::allocator<AlignedSpace>::~allocator(&local_51);
    break;
  case kCopy:
    *(undefined4 *)v2 = *v1;
    ptStack_10 = (type_info *)0x0;
    break;
  case kCopyConstruct:
    *(undefined4 *)v2 = *v1;
    ptStack_10 = (type_info *)0x0;
    break;
  case kSizeof:
    ptStack_10 = (type_info *)0x4;
    break;
  case kFastTypeId:
    ptStack_10 = (type_info *)base_internal::FastTypeId<int>();
    break;
  case kRuntimeTypeId:
    ptStack_10 = GenRuntimeTypeId<int>();
    break;
  case kParse:
    local_58 = *v2;
    local_68 = *v1;
    local_60 = *(undefined8 *)((long)v1 + 8);
    bVar1 = ParseFlag<int>(*v1,&local_58,(string *)v3);
    if (bVar1) {
      *(int *)v2 = local_58;
      ptStack_10 = (type_info *)v2;
    }
    else {
      ptStack_10 = (type_info *)0x0;
    }
    break;
  case kUnparse:
    UnparseFlag<int>((string *)&round_to,(int *)v1);
    std::__cxx11::string::operator=((string *)v2,(string *)&round_to);
    std::__cxx11::string::~string((string *)&round_to);
    ptStack_10 = (type_info *)0x0;
    break;
  case kValueOffset:
    ptStack_10 = (type_info *)0x50;
    break;
  default:
    ptStack_10 = (type_info *)0x0;
  }
  return ptStack_10;
}

Assistant:

void* FlagOps(FlagOp op, const void* v1, void* v2, void* v3) {
  struct AlignedSpace {
    alignas(MaskedPointer::RequiredAlignment()) alignas(T) char buf[sizeof(T)];
  };
  using Allocator = std::allocator<AlignedSpace>;
  switch (op) {
    case FlagOp::kAlloc: {
      Allocator alloc;
      return std::allocator_traits<Allocator>::allocate(alloc, 1);
    }
    case FlagOp::kDelete: {
      T* p = static_cast<T*>(v2);
      p->~T();
      Allocator alloc;
      std::allocator_traits<Allocator>::deallocate(
          alloc, reinterpret_cast<AlignedSpace*>(p), 1);
      return nullptr;
    }
    case FlagOp::kCopy:
      *static_cast<T*>(v2) = *static_cast<const T*>(v1);
      return nullptr;
    case FlagOp::kCopyConstruct:
      new (v2) T(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kSizeof:
      return reinterpret_cast<void*>(static_cast<uintptr_t>(sizeof(T)));
    case FlagOp::kFastTypeId:
      return const_cast<void*>(base_internal::FastTypeId<T>());
    case FlagOp::kRuntimeTypeId:
      return const_cast<std::type_info*>(GenRuntimeTypeId<T>());
    case FlagOp::kParse: {
      // Initialize the temporary instance of type T based on current value in
      // destination (which is going to be flag's default value).
      T temp(*static_cast<T*>(v2));
      if (!absl::ParseFlag<T>(*static_cast<const absl::string_view*>(v1), &temp,
                              static_cast<std::string*>(v3))) {
        return nullptr;
      }
      *static_cast<T*>(v2) = std::move(temp);
      return v2;
    }
    case FlagOp::kUnparse:
      *static_cast<std::string*>(v2) =
          absl::UnparseFlag<T>(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kValueOffset: {
      // Round sizeof(FlagImp) to a multiple of alignof(FlagValue<T>) to get the
      // offset of the data.
      size_t round_to = alignof(FlagValue<T>);
      size_t offset = (sizeof(FlagImpl) + round_to - 1) / round_to * round_to;
      return reinterpret_cast<void*>(offset);
    }
  }
  return nullptr;
}